

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventdispatcher_unix.cpp
# Opt level: O0

void __thiscall
QEventDispatcherUNIXPrivate::markPendingSocketNotifiers(QEventDispatcherUNIXPrivate *this)

{
  bool bVar1;
  pollfd *ppVar2;
  QSocketNotifierSetUNIX *pQVar3;
  uint *puVar4;
  char *pcVar5;
  QEventDispatcherUNIXPrivate *in_RDI;
  long in_FS_OFFSET;
  QSocketNotifier *notifier;
  anon_struct_8_2_24381554 *n;
  anon_struct_8_2_24381554 *__end2;
  anon_struct_8_2_24381554 *__begin2;
  anon_struct_8_2_24381554 (*__range2) [3];
  QSocketNotifierSetUNIX *sn_set;
  pollfd *pfd;
  add_const_t<QList<pollfd>_> *__range1;
  iterator it;
  const_iterator __end1;
  const_iterator __begin1;
  undefined4 in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  QSocketNotifier *notifier_00;
  anon_struct_8_2_24381554 *paVar6;
  char *this_00;
  anon_struct_8_2_24381554 *local_80;
  QMessageLogger local_50;
  piter local_30;
  pollfd *local_20;
  const_iterator local_18;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.i = (pollfd *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<pollfd>::begin((QList<pollfd> *)in_RDI);
  local_18.i = (pollfd *)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = QList<pollfd>::end((QList<pollfd> *)in_RDI);
  while( true ) {
    local_20 = local_18.i;
    bVar1 = QList<pollfd>::const_iterator::operator!=(&local_10,local_18);
    if (!bVar1) break;
    ppVar2 = QList<pollfd>::const_iterator::operator*(&local_10);
    if ((-1 < ppVar2->fd) && (ppVar2->revents != 0)) {
      local_30.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
      local_30.d = (Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_> *)&DAT_aaaaaaaaaaaaaaaa;
      local_30 = (piter)QHash<int,_QSocketNotifierSetUNIX>::find
                                  ((QHash<int,_QSocketNotifierSetUNIX> *)in_RDI,
                                   (int *)CONCAT44(in_stack_ffffffffffffff5c,
                                                   in_stack_ffffffffffffff58));
      pQVar3 = QHash<int,_QSocketNotifierSetUNIX>::iterator::value((iterator *)0x6b945a);
      this_00 = "27QEventDispatcherUNIXPrivate";
      for (local_80 = markPendingSocketNotifiers::notifiers;
          local_80 != (anon_struct_8_2_24381554 *)this_00; local_80 = local_80 + 1) {
        notifier_00 = pQVar3->notifiers[local_80->type];
        if (notifier_00 != (QSocketNotifier *)0x0) {
          paVar6 = local_80;
          if ((ppVar2->revents & 0x20U) != 0) {
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)local_80,(char *)notifier_00,(int)((ulong)in_RDI >> 0x20),
                       (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
            puVar4 = (uint *)QHash<int,_QSocketNotifierSetUNIX>::iterator::key((iterator *)0x6b9500)
            ;
            in_stack_ffffffffffffff5c = *puVar4;
            pcVar5 = socketType(paVar6->type);
            QMessageLogger::warning
                      (&local_50,"QSocketNotifier: Invalid socket %d with type %s, disabling...",
                       (ulong)in_stack_ffffffffffffff5c,pcVar5);
            QSocketNotifier::setEnabled((QSocketNotifier *)this_00,SUB81((ulong)paVar6 >> 0x38,0));
          }
          if ((ushort)(ppVar2->revents & paVar6->flags) != 0) {
            setSocketNotifierPending(in_RDI,notifier_00);
          }
        }
      }
    }
    QList<pollfd>::const_iterator::operator++(&local_10);
  }
  QList<pollfd>::clear((QList<pollfd> *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QEventDispatcherUNIXPrivate::markPendingSocketNotifiers()
{
    for (const pollfd &pfd : std::as_const(pollfds)) {
        if (pfd.fd < 0 || pfd.revents == 0)
            continue;

        auto it = socketNotifiers.find(pfd.fd);
        Q_ASSERT(it != socketNotifiers.end());

        const QSocketNotifierSetUNIX &sn_set = it.value();

        static const struct {
            QSocketNotifier::Type type;
            short flags;
        } notifiers[] = {
            { QSocketNotifier::Read,      POLLIN  | POLLHUP | POLLERR },
            { QSocketNotifier::Write,     POLLOUT | POLLHUP | POLLERR },
            { QSocketNotifier::Exception, POLLPRI | POLLHUP | POLLERR }
        };

        for (const auto &n : notifiers) {
            QSocketNotifier *notifier = sn_set.notifiers[n.type];

            if (!notifier)
                continue;

            if (pfd.revents & POLLNVAL) {
                qWarning("QSocketNotifier: Invalid socket %d with type %s, disabling...",
                         it.key(), socketType(n.type));
                notifier->setEnabled(false);
            }

            if (pfd.revents & n.flags)
                setSocketNotifierPending(notifier);
        }
    }

    pollfds.clear();
}